

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O3

int rtr_mgr_setup_sockets
              (rtr_mgr_config *config,rtr_mgr_group *groups,uint groups_len,uint refresh_interval,
              uint expire_interval,uint retry_interval)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  tommy_list_wrapper *list;
  tommy_node_struct *ptVar4;
  tommy_list ptVar5;
  tommy_node_struct *ptVar6;
  rtr_interval_mode iv_mode;
  long lVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  config->len = groups_len;
  iv_mode = retry_interval;
  list = (tommy_list_wrapper *)lrtr_malloc(8);
  config->groups = list;
  iVar3 = -1;
  if (list != (tommy_list_wrapper *)0x0) {
    list->list = (tommy_list)0x0;
    if (groups_len != 0) {
      lVar7 = 0;
      do {
        ptVar4 = (tommy_node_struct *)lrtr_malloc(0x18);
        if (ptVar4 == (tommy_node_struct *)0x0) {
LAB_00105d1f:
          iVar3 = -1;
          goto LAB_00105d24;
        }
        ptVar4->data = *(void **)((long)&groups->status + lVar7);
        puVar1 = (undefined8 *)((long)&groups->sockets + lVar7);
        ptVar6 = (tommy_node_struct *)puVar1[1];
        ptVar4->next = (tommy_node_struct *)*puVar1;
        ptVar4->prev = ptVar6;
        *(rtr_mgr_status *)&ptVar4->data = RTR_MGR_CLOSED;
        iVar3 = rtr_mgr_init_sockets
                          ((rtr_mgr_group *)ptVar4,config,refresh_interval,expire_interval,
                           retry_interval,iv_mode);
        if (iVar3 != 0) {
LAB_00105d17:
          lrtr_free(ptVar4);
          goto LAB_00105d1f;
        }
        ptVar5 = (tommy_list)lrtr_malloc(0x28);
        if (ptVar5 == (tommy_list)0x0) goto LAB_00105d17;
        ptVar5[1].next = ptVar4;
        ptVar6 = (tommy_node_struct *)config->groups;
        ptVar4 = ptVar6->next;
        if (ptVar4 == (tommy_node_struct *)0x0) {
          ptVar5->prev = ptVar5;
        }
        else {
          ptVar5->prev = ptVar4->prev;
          ptVar4->prev = ptVar5;
          ptVar6 = ptVar5->prev;
        }
        ptVar5->next = (tommy_node_struct *)0x0;
        ptVar6->next = ptVar5;
        ptVar5->data = ptVar5;
        lVar7 = lVar7 + 0x18;
      } while ((ulong)groups_len * 0x18 != lVar7);
      list = config->groups;
    }
    tommy_list_sort(&list->list,rtr_mgr_config_cmp_tommy);
    iVar3 = 0;
  }
LAB_00105d24:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_setup_sockets(struct rtr_mgr_config *config, struct rtr_mgr_group groups[],
					const unsigned int groups_len, const unsigned int refresh_interval,
					const unsigned int expire_interval, const unsigned int retry_interval)
{
	enum rtr_interval_mode iv_mode = RTR_INTERVAL_MODE_DEFAULT_MIN_MAX;
	struct rtr_mgr_group_node *group_node = NULL;
	struct rtr_mgr_group *cg = NULL;
	/* Copy the groups from the array into linked list config->groups */
	config->len = groups_len;
	config->groups = lrtr_malloc(sizeof(*config->groups));
	if (!config->groups) {
		return RTR_ERROR;
	}

	config->groups->list = NULL;

	for (unsigned int i = 0; i < groups_len; i++) {
		cg = lrtr_malloc(sizeof(struct rtr_mgr_group));
		if (!cg) {
			return RTR_ERROR;
		}

		memcpy(cg, &groups[i], sizeof(struct rtr_mgr_group));

		cg->status = RTR_MGR_CLOSED;
		if (rtr_mgr_init_sockets(cg, config, refresh_interval, expire_interval, retry_interval, iv_mode)) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node = lrtr_malloc(sizeof(struct rtr_mgr_group_node));
		if (!group_node) {
			lrtr_free(cg);
			return RTR_ERROR;
		}

		group_node->group = cg;
		tommy_list_insert_tail(&config->groups->list, &group_node->node, group_node);
	}
	/* Our linked list should be sorted already, since the groups array was
	 * sorted. However, for safety reasons we sort again.
	 */
	tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp_tommy);

	return RTR_SUCCESS;
}